

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ogt_vox_scene *scene;
  ulong in_RCX;
  uint uVar4;
  double dVar5;
  allocator local_9d;
  uint32_t local_9c;
  uint32_t local_98;
  float local_94;
  char *local_90;
  char *local_88;
  ulong local_80;
  undefined8 local_78;
  string output_prefix;
  string local_50 [32];
  
  if (argc == 1) {
    print_help();
    iVar3 = 0;
    printf("\n\nPress enter to continue!");
    std::istream::get();
  }
  else {
    local_90 = "polygon";
    local_94 = 1.0;
    local_88 = (char *)0x0;
    local_78 = 0;
    local_80 = 0;
    local_9c = 0xffffffff;
    local_98 = local_9c;
    for (uVar4 = 1; (int)uVar4 < argc; uVar4 = uVar4 + iVar3) {
      pcVar1 = argv[uVar4];
      iVar3 = strcmp(pcVar1,"--mesh_algorithm");
      if (iVar3 == 0) {
        local_90 = argv[(ulong)uVar4 + 1];
        goto LAB_0010ee9f;
      }
      iVar3 = strcmp(pcVar1,"--all_frames_in_one");
      if (iVar3 == 0) {
        local_78 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
        iVar3 = 1;
      }
      else {
        iVar3 = strcmp(pcVar1,"--frames");
        if (iVar3 == 0) {
          local_98 = atoi(argv[(ulong)uVar4 + 1]);
          local_9c = atoi(argv[(ulong)uVar4 + 2]);
          iVar3 = 3;
        }
        else {
          iVar3 = strcmp(pcVar1,"--output_name");
          if (iVar3 == 0) {
            local_88 = argv[(ulong)uVar4 + 1];
          }
          else {
            iVar3 = strcmp(pcVar1,"--scale");
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar1,"--output_vox");
              if (iVar3 == 0) {
                iVar3 = 1;
                in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
                local_80 = in_RCX;
                goto LAB_0010eecd;
              }
              if ((*pcVar1 != '-') || (pcVar1[1] != '-')) {
                scene = load_vox_scene(pcVar1,0xf);
                if (scene == (ogt_vox_scene *)0x0) {
                  printf("ERROR: could not load input file: %s",pcVar1);
                  return 3;
                }
                output_prefix._M_dataplus._M_p = (pointer)&output_prefix.field_2;
                output_prefix._M_string_length = 0;
                output_prefix.field_2._M_local_buf[0] = '\0';
                if (local_88 == (char *)0x0) {
                  std::__cxx11::string::string(local_50,pcVar1,&local_9d);
                  std::__cxx11::string::operator=((string *)&output_prefix,local_50);
                  std::__cxx11::string::~string(local_50);
                  std::__cxx11::string::find((char)&output_prefix,0x2e);
                  std::__cxx11::string::substr((ulong)local_50,(ulong)&output_prefix);
                }
                else {
                  std::__cxx11::string::string(local_50,local_88,&local_9d);
                }
                std::__cxx11::string::operator=((string *)&output_prefix,local_50);
                std::__cxx11::string::~string(local_50);
                pcVar1 = local_90;
                if ((local_80 & 1) == 0) {
                  iVar3 = strcmp(local_90,"polygon");
                  if (((iVar3 != 0) && (iVar3 = strcmp(pcVar1,"greedy"), iVar3 != 0)) &&
                     (iVar3 = strcmp(pcVar1,"simple"), iVar3 != 0)) {
                    printf("ERROR: invalid mesh algorithm specified: %s",pcVar1);
                    print_help();
                    iVar3 = 2;
                    goto LAB_0010f0af;
                  }
                  bVar2 = export_scene_anim_as_obj
                                    (scene,&output_prefix,(bool)(((byte)local_78 ^ 1) & 1),local_94,
                                     local_98,local_9c,pcVar1);
                }
                else {
                  bVar2 = export_scene_anim_as_vox(scene,&output_prefix,local_98,local_9c);
                }
                ogt_vox_destroy_scene(scene);
                iVar3 = (uint)bVar2 << 2;
LAB_0010f0af:
                std::__cxx11::string::~string((string *)&output_prefix);
                return iVar3;
              }
              printf("ERROR: unrecognized parameter \'%s\'\n",pcVar1);
              goto LAB_0010ef07;
            }
            dVar5 = atof(argv[(ulong)uVar4 + 1]);
            local_94 = (float)dVar5;
          }
LAB_0010ee9f:
          iVar3 = 2;
        }
      }
LAB_0010eecd:
    }
    puts("ERROR: expected last argument to be input file");
    print_help();
LAB_0010ef07:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
    // print help if no args are provided
    if (argc == 1) {
        print_help();
        // wait for keyboard input
        printf("\n\nPress enter to continue!");
        std::cin.get();

        return 0;
    }

    // default parameter values
    const char* input_file        = nullptr;
    const char* mesh_algorithm    = "polygon";
    const char* output_name       = nullptr;
    bool        all_frames_in_one = false;
    bool        output_as_vox     = false;
    uint32_t    frame_min         = UINT32_MAX; // auto!
    uint32_t    frame_max         = UINT32_MAX; // auto!
    float       scale             = 1.0f;

    // parse arguments and override default parameter values
    for (int i = 1; i < argc; ) {
        if (strcmp(argv[i], "--mesh_algorithm")==0) {
            mesh_algorithm = argv[i+1];
            i += 2;
        }
        else if (strcmp(argv[i], "--all_frames_in_one") == 0) {
            all_frames_in_one = true;
            i++;
        }
        else if (strcmp(argv[i], "--frames") == 0) {
            frame_min = atoi(argv[i+1]);
            frame_max = atoi(argv[i+2]);
            i += 3;
        }
        else if (strcmp(argv[i], "--output_name") == 0) {
            output_name = argv[i+1];
            i += 2;
        }
        else if (strcmp(argv[i], "--scale") == 0) {
            scale = (float)atof(argv[i+1]);
            i += 2;
        }
        else if (strcmp(argv[i], "--output_vox") == 0) {
            output_as_vox = true;
            i++;
        }
        else if (strncmp(argv[i], "--", 2) == 0) {
            printf("ERROR: unrecognized parameter '%s'\n", argv[i]);
            return 1;
        }
        else {
            input_file = argv[i];
            break;
        }
    }

    // validate that an input file was specified.
    if (!input_file) {
        printf("ERROR: expected last argument to be input file\n");
        print_help();
        return 1;
    }

    uint32_t read_scene_flags = k_read_scene_flags_keyframes | k_read_scene_flags_groups | k_read_scene_flags_keep_empty_models_instances | k_read_scene_flags_keep_duplicate_models;

    const ogt_vox_scene* scene = load_vox_scene(input_file, read_scene_flags);
    if (!scene) {
        printf("ERROR: could not load input file: %s", input_file);
        return 3;
    }

    // either use the output prefix specified, or generate one from the input filename.
    std::string output_prefix;
    if (!output_name) {
        output_prefix = std::string(input_file);
        output_prefix = output_prefix.substr(0, output_prefix.find_first_of('.'));
    }
    else {
        output_prefix = std::string(output_name);
    }

    bool ret = false;
    if (output_as_vox) {
        ret = export_scene_anim_as_vox(scene, output_prefix, frame_min, frame_max);
    }
    else {
        bool output_file_per_frame = !all_frames_in_one;
        // validate specified mesh_algorithm is one of "polygon", "greedy" or "simple"
        if (strcmp(mesh_algorithm, "polygon") != 0 &&
            strcmp(mesh_algorithm, "greedy") != 0 &&
            strcmp(mesh_algorithm, "simple") != 0)
        {
            printf("ERROR: invalid mesh algorithm specified: %s", mesh_algorithm);
            print_help();
            return 2;
        }
        ret = export_scene_anim_as_obj(scene, output_prefix, output_file_per_frame, scale, frame_min, frame_max, mesh_algorithm);
    }
    ogt_vox_destroy_scene(scene);

    return ret ? 4 : 0;
}